

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_iterator.h
# Opt level: O0

void __thiscall
spvtools::opt::TreeDFIterator<const_spvtools::opt::SENode>::TreeDFIterator
          (TreeDFIterator<const_spvtools::opt::SENode> *this,NodePtr top_node)

{
  bool local_41;
  __normal_iterator<spvtools::opt::SENode_*const_*,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
  local_40;
  pair<const_spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_*const_*,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>
  local_38;
  __normal_iterator<spvtools::opt::SENode_*const_*,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
  local_28;
  __normal_iterator<spvtools::opt::SENode_*const_*,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>
  local_20;
  NodePtr local_18;
  NodePtr top_node_local;
  TreeDFIterator<const_spvtools::opt::SENode> *this_local;
  
  this->current_ = top_node;
  local_18 = top_node;
  top_node_local = (NodePtr)this;
  std::
  stack<std::pair<spvtools::opt::SENode_const*,__gnu_cxx::__normal_iterator<spvtools::opt::SENode*const*,std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>>>,std::deque<std::pair<spvtools::opt::SENode_const*,__gnu_cxx::__normal_iterator<spvtools::opt::SENode*const*,std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>>>,std::allocator<std::pair<spvtools::opt::SENode_const*,__gnu_cxx::__normal_iterator<spvtools::opt::SENode*const*,std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>>>>>>
  ::
  stack<std::deque<std::pair<spvtools::opt::SENode_const*,__gnu_cxx::__normal_iterator<spvtools::opt::SENode*const*,std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>>>,std::allocator<std::pair<spvtools::opt::SENode_const*,__gnu_cxx::__normal_iterator<spvtools::opt::SENode*const*,std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>>>>>,void>
            ((stack<std::pair<spvtools::opt::SENode_const*,__gnu_cxx::__normal_iterator<spvtools::opt::SENode*const*,std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>>>,std::deque<std::pair<spvtools::opt::SENode_const*,__gnu_cxx::__normal_iterator<spvtools::opt::SENode*const*,std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>>>,std::allocator<std::pair<spvtools::opt::SENode_const*,__gnu_cxx::__normal_iterator<spvtools::opt::SENode*const*,std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>>>>>>
              *)&this->parent_iterators_);
  local_41 = false;
  if (this->current_ != (NodePtr)0x0) {
    local_20._M_current = (SENode **)SENode::begin(this->current_);
    local_28._M_current = (SENode **)SENode::end(this->current_);
    local_41 = __gnu_cxx::operator!=(&local_20,&local_28);
  }
  if (local_41 != false) {
    local_40._M_current = (SENode **)SENode::begin(this->current_);
    local_38 = std::
               make_pair<spvtools::opt::SENode_const*&,__gnu_cxx::__normal_iterator<spvtools::opt::SENode*const*,std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>>>
                         (&this->current_,&local_40);
    std::
    stack<std::pair<spvtools::opt::SENode_const*,__gnu_cxx::__normal_iterator<spvtools::opt::SENode*const*,std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>>>,std::deque<std::pair<spvtools::opt::SENode_const*,__gnu_cxx::__normal_iterator<spvtools::opt::SENode*const*,std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>>>,std::allocator<std::pair<spvtools::opt::SENode_const*,__gnu_cxx::__normal_iterator<spvtools::opt::SENode*const*,std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>>>>>>
    ::
    emplace<std::pair<spvtools::opt::SENode_const*,__gnu_cxx::__normal_iterator<spvtools::opt::SENode*const*,std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>>>>
              ((stack<std::pair<spvtools::opt::SENode_const*,__gnu_cxx::__normal_iterator<spvtools::opt::SENode*const*,std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>>>,std::deque<std::pair<spvtools::opt::SENode_const*,__gnu_cxx::__normal_iterator<spvtools::opt::SENode*const*,std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>>>,std::allocator<std::pair<spvtools::opt::SENode_const*,__gnu_cxx::__normal_iterator<spvtools::opt::SENode*const*,std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>>>>>>
                *)&this->parent_iterators_,&local_38);
  }
  return;
}

Assistant:

explicit inline TreeDFIterator(NodePtr top_node) : current_(top_node) {
    if (current_ && current_->begin() != current_->end())
      parent_iterators_.emplace(make_pair(current_, current_->begin()));
  }